

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miner_tests.cpp
# Opt level: O3

CTxMemPool * __thiscall miner_tests::MinerTestingSetup::MakeMempool(MinerTestingSetup *this)

{
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  CTxMemPool *__ptr;
  tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_> tVar3;
  __uniq_ptr_data<CTxMemPool,_std::default_delete<CTxMemPool>,_true,_true> this_01;
  long lVar4;
  Options *pOVar5;
  undefined8 *puVar6;
  long in_FS_OFFSET;
  byte bVar7;
  bilingual_str error;
  Options in_stack_fffffffffffffec8;
  Options local_d0;
  bilingual_str local_68;
  long local_28;
  
  bVar7 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.
             mempool;
  __ptr = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool.
          _M_t.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
          super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
          super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
  super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl = (CTxMemPool *)0x0;
  if (__ptr != (CTxMemPool *)0x0) {
    std::default_delete<CTxMemPool>::operator()((default_delete<CTxMemPool> *)this_00,__ptr);
  }
  paVar1 = &local_68.original.field_2;
  local_68.original._M_string_length = 0;
  local_68.original.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_68.translated.field_2;
  local_68.translated._M_string_length = 0;
  local_68.translated.field_2._M_local_buf[0] = '\0';
  local_68.original._M_dataplus._M_p = (pointer)paVar1;
  local_68.translated._M_dataplus._M_p = (pointer)paVar2;
  MemPoolOptionsForTest
            (&local_d0,
             &(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node);
  this_01.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
  super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       (__uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>)operator_new(0x248);
  pOVar5 = &local_d0;
  puVar6 = (undefined8 *)&stack0xfffffffffffffec8;
  for (lVar4 = 0xd; lVar4 != 0; lVar4 = lVar4 + -1) {
    *puVar6 = *(undefined8 *)pOVar5;
    pOVar5 = (Options *)((long)pOVar5 + ((ulong)bVar7 * -2 + 1) * 8);
    puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
  }
  CTxMemPool::CTxMemPool
            ((CTxMemPool *)
             this_01.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,in_stack_fffffffffffffec8,
             &local_68);
  tVar3.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_> *)
        &(this_00->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>;
  (this_00->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_> =
       this_01.super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
       super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
       super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  if (tVar3.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
      super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl !=
      (_Head_base<0UL,_CTxMemPool_*,_false>)0x0) {
    std::default_delete<CTxMemPool>::operator()
              ((default_delete<CTxMemPool> *)this_00,
               (CTxMemPool *)
               tVar3.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
               super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  }
  local_d0.check_ratio._0_1_ = local_68.original._M_string_length == 0;
  inline_assertion_check<true,bool>
            ((bool *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/miner_tests.cpp"
             ,0x36,"MakeMempool","error.empty()");
  tVar3.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
  super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_> *)
        &(this_00->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.translated._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.translated._M_dataplus._M_p,
                    CONCAT71(local_68.translated.field_2._M_allocated_capacity._1_7_,
                             local_68.translated.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.original._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.original._M_dataplus._M_p,
                    CONCAT71(local_68.original.field_2._M_allocated_capacity._1_7_,
                             local_68.original.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (CTxMemPool *)
           (tuple<CTxMemPool_*,_std::default_delete<CTxMemPool>_>)
           tVar3.super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
           super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

CTxMemPool& MakeMempool()
    {
        // Delete the previous mempool to ensure with valgrind that the old
        // pointer is not accessed, when the new one should be accessed
        // instead.
        m_node.mempool.reset();
        bilingual_str error;
        m_node.mempool = std::make_unique<CTxMemPool>(MemPoolOptionsForTest(m_node), error);
        Assert(error.empty());
        return *m_node.mempool;
    }